

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::
VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody
          (VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test *this)

{
  KeyValue *pKVar1;
  byte bVar2;
  Descriptor *pDVar3;
  OneofDescriptor *pOVar4;
  MapDynamicFieldInfo<const_google::protobuf::Message> info;
  _lambda_auto_1__1_ *p_Var5;
  VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test *pVVar6;
  bool bVar7;
  CppStringType CVar8;
  int iVar9;
  uint32_t *puVar10;
  SooRep *this_00;
  RepeatedPtrIterator<const_google::protobuf::Message> RVar11;
  RepeatedPtrField<google::protobuf::Message> *pRVar12;
  Descriptor *this_01;
  FieldDescriptor *val_f;
  ExtensionSet *pEVar13;
  undefined8 extraout_RAX;
  Reflection *this_02;
  FieldDescriptor *field;
  KeyValue *pKVar14;
  char *message;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> this_03;
  KeyValue *pKVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  string_view str;
  string_view str_00;
  Metadata MVar19;
  iterator_range<google::protobuf::internal::RepeatedPtrIterator<const_google::protobuf::Message>_>
  iVar20;
  int count;
  Descriptor *extendee;
  _lambda_auto_1__1_ *local_110;
  InternalMetadata local_108;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_100;
  FieldDescriptor *local_f8;
  RepeatedPtrField<google::protobuf::Message> *local_f0;
  uint32_t *local_e0;
  undefined1 local_d8 [40];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_b0;
  undefined1 local_a8 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_a0;
  FieldDescriptor *local_98;
  FieldDescriptor *pFStack_90;
  DescriptorPool *local_88;
  MapFieldBase *pMStack_80;
  FieldDescriptor *local_78;
  TcParseTableBase *local_70;
  VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test *local_68;
  uint32_t *local_60;
  ReflectionSchema *local_58;
  long local_50;
  undefined1 *local_48;
  DescriptorPool *local_40;
  DescriptorNames local_38;
  
  local_48 = local_d8 + 4;
  local_d8._4_4_ = 0;
  this_03._M_head_impl = (LogMessageData *)(this->super_VisitFieldsTest).message_;
  local_110 = (_lambda_auto_1__1_ *)&local_48;
  local_d8._0_4_ = 0x400;
  MVar19 = Message::GetMetadata((Message *)this_03._M_head_impl);
  this_02 = MVar19.reflection;
  if (0 < (this_02->schema_).weak_field_map_offset_) {
LAB_008eb2f9:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    str_00._M_str = "weak fields are not supported";
    str_00._M_len = 0x1d;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_a8,str_00);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_a8)
    ;
  }
  local_68 = this;
  if ((this_02->schema_).has_bits_offset_ == -1) {
    puVar10 = (uint32_t *)0x0;
  }
  else {
    puVar10 = Reflection::GetHasBits(this_02,(Message *)this_03._M_head_impl);
  }
  pDVar3 = this_02->descriptor_;
  local_50 = (long)pDVar3->field_count_;
  if (0 < local_50) {
    local_58 = &this_02->schema_;
    local_60 = (this_02->schema_).has_bit_indices_;
    lVar17 = 0;
    local_e0 = puVar10;
    local_b0._M_head_impl = this_03._M_head_impl;
    do {
      if (pDVar3->field_count_ <= lVar17) {
        internal::_GLOBAL__N_1::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test
        ::TestBody();
LAB_008eb2aa:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                   ,0x6e,"!field->options().weak()");
        str._M_str = "weak fields are not supported";
        str._M_len = 0x1d;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)&local_108,str);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_108);
      }
      if (((pDVar3->fields_[lVar17].options_)->field_0)._impl_.weak_ == true) goto LAB_008eb2aa;
      field = pDVar3->fields_ + lVar17;
      if ((local_d8._0_4_ != 0xffffffff) &&
         (((uint)local_d8._0_4_ >>
           (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) & 0x1f) & 1) ==
          0)) goto LAB_008eaf9f;
      bVar2 = field->field_0x1;
      if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) {
        internal::_GLOBAL__N_1::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test
        ::TestBody();
        goto LAB_008eb2f9;
      }
      if ((bVar2 & 0x20) == 0) {
        bVar7 = ReflectionSchema::InRealOneof(local_58,field);
        if (bVar7) {
          pOVar4 = (field->scope_).containing_oneof;
          if (pOVar4 == (OneofDescriptor *)0x0) {
            protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
          if ((ulong)*(uint *)((long)&((this_03._M_head_impl)->entry).full_filename_._M_len +
                              (long)((int)((ulong)((long)pOVar4 -
                                                  (long)pOVar4->containing_type_->oneof_decls_) >> 3
                                          ) * -0x49249249) * 4 +
                              (ulong)(uint)(this_02->schema_).oneof_case_offset_) !=
              (long)field->number_) goto LAB_008eaf9f;
          bVar2 = field->type_;
          if (0x12 < bVar2) goto LAB_008eb370;
          if ((0x7e1feU >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008eaf9f;
          if ((0xc00U >> (bVar2 & 0x1f) & 1) == 0) {
            if ((0x1200U >> (bVar2 & 0x1f) & 1) == 0) goto LAB_008eb370;
LAB_008eadf3:
            FieldDescriptor::cpp_string_type(field);
          }
          else {
LAB_008eae5f:
            p_Var5 = local_110;
            Reflection::GetMessage
                      (this_02,(Message *)this_03._M_head_impl,field,(MessageFactory *)0x0);
            **(int **)p_Var5 = **(int **)p_Var5 + 1;
            puVar10 = local_e0;
          }
        }
        else if ((puVar10 == (uint32_t *)0x0) || (uVar16 = local_60[lVar17], uVar16 == 0xffffffff))
        {
          bVar7 = Reflection::HasFieldSingular(this_02,(Message *)this_03._M_head_impl,field);
          if (bVar7) goto LAB_008eadc0;
        }
        else if ((puVar10[uVar16 >> 5] >> (uVar16 & 0x1f) & 1) != 0) {
LAB_008eadc0:
          bVar2 = field->type_;
          if (bVar2 < 0x13) {
            if ((0x7e1feU >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008eaf9f;
            if ((0xc00U >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008eae5f;
            if ((0x1200U >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008eadf3;
          }
LAB_008eb36b:
          internal::_GLOBAL__N_1::
          VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody();
LAB_008eb370:
          internal::_GLOBAL__N_1::
          VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody();
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_d8 + 8));
          if ((Reflection *)local_108.ptr_ != (Reflection *)0x0) {
            (**(code **)(*(long *)local_108.ptr_ + 8))();
          }
          if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )_Stack_a0._M_head_impl != (LogMessageData *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&_Stack_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Stack_a0._M_head_impl);
          }
          _Unwind_Resume(extraout_RAX);
        }
        goto LAB_008eaf9f;
      }
      switch(field->type_) {
      case '\x01':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                             (this_02,(Message *)this_03._M_head_impl,field)->soo_rep_;
        break;
      case '\x02':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                             (this_02,(Message *)this_03._M_head_impl,field)->soo_rep_;
        break;
      case '\x03':
      case '\x10':
      case '\x12':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                             (this_02,(Message *)this_03._M_head_impl,field)->soo_rep_;
        break;
      case '\x04':
      case '\x06':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                             (this_02,(Message *)this_03._M_head_impl,field)->soo_rep_;
        break;
      case '\x05':
      case '\x0e':
      case '\x0f':
      case '\x11':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                             (this_02,(Message *)this_03._M_head_impl,field)->soo_rep_;
        break;
      case '\a':
      case '\r':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                             (this_02,(Message *)this_03._M_head_impl,field)->soo_rep_;
        break;
      case '\b':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                             (this_02,(Message *)this_03._M_head_impl,field)->soo_rep_;
        break;
      case '\t':
      case '\f':
        CVar8 = FieldDescriptor::cpp_string_type(field);
        if (CVar8 - kView < 3) {
          Reflection::GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                    (this_02,(Message *)this_03._M_head_impl,field);
        }
        goto LAB_008eaf9f;
      case '\n':
        pRVar12 = Reflection::
                  GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                            (this_02,(Message *)this_03._M_head_impl,field);
        if ((pRVar12->super_RepeatedPtrFieldBase).current_size_ != 0) {
          local_108.ptr_ = (intptr_t)this_02;
          local_100._M_head_impl = this_03._M_head_impl;
          local_f8 = field;
          local_f0 = pRVar12;
          iVar20 = RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
                   ::Get((RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
                          *)&local_108);
          p_Var5 = local_110;
          puVar10 = local_e0;
          this_03._M_head_impl = local_b0._M_head_impl;
          for (RVar11 = iVar20.begin_iterator_.it_; local_e0 = puVar10,
              local_b0._M_head_impl = this_03._M_head_impl,
              RVar11.it_ != iVar20.end_iterator_.it_.it_; RVar11.it_ = RVar11.it_ + 1) {
            DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar11.it_);
            **(int **)p_Var5 = **(int **)p_Var5 + 1;
            puVar10 = local_e0;
            this_03._M_head_impl = local_b0._M_head_impl;
          }
        }
        goto LAB_008eaf9f;
      case '\v':
        bVar7 = FieldDescriptor::is_map_message_type(field);
        if (bVar7) {
          local_70 = (TcParseTableBase *)
                     Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                               (this_02,(Message *)this_03._M_head_impl,field);
          iVar9 = MapFieldBase::size((MapFieldBase *)local_70);
          if (iVar9 != 0) {
            this_01 = FieldDescriptor::message_type(field);
            local_78 = Descriptor::map_key(this_01);
            puVar10 = local_e0;
            val_f = Descriptor::map_value(this_01);
            MapDynamicFieldInfo<const_google::protobuf::Message>::MapDynamicFieldInfo
                      ((MapDynamicFieldInfo<const_google::protobuf::Message> *)local_a8,this_02,
                       (Message *)this_03._M_head_impl,field,local_78,val_f,(MapFieldBase *)local_70
                      );
            info.reflection._1_7_ = local_a8._1_7_;
            info.reflection._0_1_ = local_a8[0];
            info.message = (Message *)_Stack_a0._M_head_impl;
            info.field = local_98;
            info.key = pFStack_90;
            info.value = (FieldDescriptor *)local_88;
            info.const_map_field = pMStack_80;
            ReflectionVisit::
            VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)
            ::{lambda(auto:1)#1}::operator()(local_110,info);
          }
        }
        else {
          pRVar12 = Reflection::
                    GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                              (this_02,(Message *)this_03._M_head_impl,field);
          if ((pRVar12->super_RepeatedPtrFieldBase).current_size_ != 0) {
            local_108.ptr_ = (intptr_t)this_02;
            local_100._M_head_impl = this_03._M_head_impl;
            local_f8 = field;
            local_f0 = pRVar12;
            iVar20 = RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
                     ::Get((RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
                            *)&local_108);
            p_Var5 = local_110;
            puVar10 = local_e0;
            this_03._M_head_impl = local_b0._M_head_impl;
            for (RVar11 = iVar20.begin_iterator_.it_; local_e0 = puVar10,
                local_b0._M_head_impl = this_03._M_head_impl,
                RVar11.it_ != iVar20.end_iterator_.it_.it_; RVar11.it_ = RVar11.it_ + 1) {
              DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar11.it_);
              **(int **)p_Var5 = **(int **)p_Var5 + 1;
              puVar10 = local_e0;
              this_03._M_head_impl = local_b0._M_head_impl;
            }
          }
        }
        goto LAB_008eaf9f;
      default:
        internal::_GLOBAL__N_1::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test
        ::TestBody();
        goto LAB_008eb36b;
      }
      SooRep::size(this_00,(undefined1  [16])
                           ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                           (undefined1  [16])0x0);
LAB_008eaf9f:
      lVar17 = lVar17 + 1;
    } while (lVar17 != local_50);
  }
  pVVar6 = local_68;
  if ((this_02->schema_).extensions_offset_ != -1) {
    pEVar13 = Reflection::GetExtensionSet(this_02,(Message *)this_03._M_head_impl);
    local_38.payload_ = (char *)this_02->descriptor_;
    local_d8._32_8_ = &local_38;
    local_40 = this_02->descriptor_pool_;
    local_d8._24_8_ = &local_40;
    local_d8._8_8_ = local_d8;
    local_d8._16_8_ = &local_110;
    lVar17 = (long)(short)pEVar13->flat_size_;
    pKVar14 = (pEVar13->map_).flat;
    if (lVar17 < 0) {
      internal::_GLOBAL__N_1::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::
      TestBody();
    }
    else {
      lVar18 = lVar17 * 0x20;
      pKVar1 = pKVar14 + lVar17;
      pKVar15 = pKVar14;
      local_108.ptr_ = local_d8._8_8_;
      local_100._M_head_impl = (LogMessageData *)local_d8._16_8_;
      local_f8 = (FieldDescriptor *)local_d8._24_8_;
      local_f0 = (RepeatedPtrField<google::protobuf::Message> *)local_d8._32_8_;
      if (pEVar13->flat_size_ != 0) {
        uVar16 = 0;
        do {
          lVar18 = lVar18 + -0x20;
          ExtensionSet::Extension::PrefetchPtr(&pKVar15->second);
          pKVar15 = pKVar15 + 1;
          if (lVar18 == 0) break;
          bVar7 = uVar16 < 0xf;
          uVar16 = uVar16 + 1;
        } while (bVar7);
      }
      if (pKVar15 != pKVar1) {
        do {
          ReflectionVisit::
          VisitFields<google::protobuf::Message_const,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&local_108,pKVar14->first,&pKVar14->second);
          ExtensionSet::Extension::PrefetchPtr(&pKVar15->second);
          pKVar14 = pKVar14 + 1;
          pKVar15 = pKVar15 + 1;
        } while (pKVar15 != pKVar1);
      }
      if (pKVar14 != pKVar1) {
        do {
          ReflectionVisit::
          VisitFields<google::protobuf::Message_const,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&local_108,pKVar14->first,&pKVar14->second);
          pKVar14 = pKVar14 + 1;
        } while (pKVar14 != pKVar1);
      }
    }
  }
  iVar9 = CountAllMessageFieldsViaListFields
                    ((pVVar6->super_VisitFieldsTest).reflection_,
                     (pVVar6->super_VisitFieldsTest).message_);
  local_108.ptr_._0_4_ = iVar9;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a8,"count",
             "CountAllMessageFieldsViaListFields(reflection_, *message_)",(int *)(local_d8 + 4),
             (int *)&local_108);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
        _Stack_a0._M_head_impl ==
        (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)0x0)
    {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (char *)((_Stack_a0._M_head_impl)->entry).full_filename_._M_len;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_d8 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
               ,0x71,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_d8 + 8),(Message *)&local_108)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_d8 + 8));
    if ((long *)local_108.ptr_ != (long *)0x0) {
      (**(code **)(*(long *)local_108.ptr_ + 8))();
    }
  }
  if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
       )_Stack_a0._M_head_impl !=
      (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_a0._M_head_impl);
  }
  return;
}

Assistant:

TEST_P(VisitFieldsTest, VisitMessageFieldsCountIncludesRepeatedElements) {
  int count = 0;
  VisitMessageFields(*message_, [&](const Message& msg) { ++count; });

  EXPECT_EQ(count, CountAllMessageFieldsViaListFields(reflection_, *message_));
}